

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::remove_check(Fl_Timeout_Handler cb,void *argp)

{
  Check *pCVar1;
  Check *t;
  Check **p;
  void *argp_local;
  Fl_Timeout_Handler cb_local;
  
  t = (Check *)&first_check;
  while (t->cb != (_func_void_void_ptr *)0x0) {
    pCVar1 = (Check *)t->cb;
    if ((pCVar1->cb == cb) && (pCVar1->arg == argp)) {
      if (next_check == pCVar1) {
        next_check = pCVar1->next;
      }
      t->cb = (_func_void_void_ptr *)pCVar1->next;
      pCVar1->next = free_check;
      free_check = pCVar1;
    }
    else {
      t = (Check *)&pCVar1->next;
    }
  }
  return;
}

Assistant:

void Fl::remove_check(Fl_Timeout_Handler cb, void *argp) {
  for (Check** p = &first_check; *p;) {
    Check* t = *p;
    if (t->cb == cb && t->arg == argp) {
      if (next_check == t) next_check = t->next;
      *p = t->next;
      t->next = free_check;
      free_check = t;
    } else {
      p = &(t->next);
    }
  }
}